

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEVPSymmetricAlgorithm.cpp
# Opt level: O2

bool __thiscall
OSSLEVPSymmetricAlgorithm::encryptUpdate
          (OSSLEVPSymmetricAlgorithm *this,ByteString *data,ByteString *encryptedData)

{
  unsigned_long *puVar1;
  BIGNUM *a;
  EVP_CIPHER_CTX *ctx;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  undefined4 extraout_var;
  uchar *out;
  uchar *in;
  ulong e;
  char *pcVar5;
  int outLen;
  ByteString dummy;
  
  bVar2 = SymmetricAlgorithm::encryptUpdate(&this->super_SymmetricAlgorithm,data,encryptedData);
  if (bVar2) {
    sVar4 = ByteString::size(data);
    if (sVar4 == 0) {
      ByteString::resize(encryptedData,0);
      bVar2 = true;
    }
    else {
      if (this->maximumBytes != (BIGNUM *)0x0) {
        a = (BIGNUM *)this->counterBytes;
        sVar4 = ByteString::size(data);
        BN_add_word(a,sVar4);
      }
      sVar4 = ByteString::size(data);
      iVar3 = (*(this->super_SymmetricAlgorithm)._vptr_SymmetricAlgorithm[0xd])(this);
      ByteString::resize(encryptedData,(sVar4 + CONCAT44(extraout_var,iVar3)) - 1);
      sVar4 = ByteString::size(encryptedData);
      outLen = (int)sVar4;
      ctx = (EVP_CIPHER_CTX *)this->pCurCTX;
      out = ByteString::operator[](encryptedData,0);
      in = ByteString::const_byte_str(data);
      sVar4 = ByteString::size(data);
      iVar3 = EVP_EncryptUpdate(ctx,out,&outLen,in,(int)sVar4);
      bVar2 = iVar3 != 0;
      if (iVar3 == 0) {
        e = ERR_get_error();
        pcVar5 = ERR_error_string(e,(char *)0x0);
        softHSMLog(3,"encryptUpdate",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPSymmetricAlgorithm.cpp"
                   ,0xf4,"EVP_EncryptUpdate failed: %s",pcVar5);
        clean(this);
        ByteString::ByteString(&dummy);
        SymmetricAlgorithm::encryptFinal(&this->super_SymmetricAlgorithm,&dummy);
        ByteString::~ByteString(&dummy);
      }
      else {
        ByteString::resize(encryptedData,(long)outLen);
        puVar1 = &(this->super_SymmetricAlgorithm).currentBufferSize;
        *puVar1 = *puVar1 - (long)outLen;
      }
    }
  }
  else {
    clean(this);
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool OSSLEVPSymmetricAlgorithm::encryptUpdate(const ByteString& data, ByteString& encryptedData)
{
	if (!SymmetricAlgorithm::encryptUpdate(data, encryptedData))
	{
		clean();
		return false;
	}

	if (data.size() == 0)
	{
		encryptedData.resize(0);

		return true;
	}

	// Count number of bytes written
	if (maximumBytes)
	{
		BN_add_word(counterBytes, data.size());
	}

	// Prepare the output block
	encryptedData.resize(data.size() + getBlockSize() - 1);

	int outLen = encryptedData.size();
	if (!EVP_EncryptUpdate(pCurCTX, &encryptedData[0], &outLen, (unsigned char*) data.const_byte_str(), data.size()))
	{
		ERROR_MSG("EVP_EncryptUpdate failed: %s", ERR_error_string(ERR_get_error(), NULL));

		clean();

		ByteString dummy;
		SymmetricAlgorithm::encryptFinal(dummy);

		return false;
	}

	// Resize the output block
	encryptedData.resize(outLen);
	currentBufferSize -= outLen;

	return true;
}